

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.h
# Opt level: O0

void __thiscall Player::~Player(Player *this)

{
  Player *this_local;
  
  this->_vptr_Player = (_func_int **)&PTR_nextRound_00127ad8;
  std::vector<Card,_std::allocator<Card>_>::~vector(&this->m_cards);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

Player(std::string name = "noName") : m_name(name) {}